

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electron.cpp
# Opt level: O2

void __thiscall Electron::ConcreteMachine<false>::scsi_bus_did_change(ConcreteMachine<false> *this)

{
  BusState in_EDX;
  Bus *in_RSI;
  double in_XMM0_Qa;
  
  scsi_bus_did_change((ConcreteMachine<false> *)&this[-1].sound_generator_,in_RSI,in_EDX,in_XMM0_Qa)
  ;
  return;
}

Assistant:

void scsi_bus_did_change(SCSI::Bus *, SCSI::BusState new_state, double) final {
			// Release acknowledge when request is released.
			if(scsi_acknowledge_ && !(new_state & SCSI::Line::Request)) {
				scsi_acknowledge_ = false;
				push_scsi_output();
			}

			// Output occurs only while SCSI::Line::Input is inactive; therefore a change
			// in that line affects what's on the bus.
			if(((new_state^previous_bus_state_)&SCSI::Line::Input)) {
				push_scsi_output();
			}

			scsi_interrupt_state_ |= (new_state^previous_bus_state_)&new_state & SCSI::Line::Request;
			previous_bus_state_ = new_state;
			evaluate_interrupts();
		}